

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:264:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:264:7)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  AsyncIoProvider *ioProvider;
  AsyncIoStream *stream;
  WaitScope *waitScope;
  WaitScope *params_local_2;
  AsyncIoStream *params_local_1;
  AsyncIoProvider *params_local;
  Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:264:7)>
  *this_local;
  
  ioProvider = fwd<kj::AsyncIoProvider&>(params);
  stream = fwd<kj::AsyncIoStream&>(params_1);
  waitScope = fwd<kj::WaitScope&>(params_2);
  NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:264:7)>
  ::Type::operator()(&this->field_0x8,ioProvider,stream,waitScope);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }